

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

TestCase * __thiscall
Catch::TestCase::withName(TestCase *__return_storage_ptr__,TestCase *this,string *_newName)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  TestCaseInfo::TestCaseInfo(&__return_storage_ptr__->super_TestCaseInfo,&this->super_TestCaseInfo);
  (__return_storage_ptr__->test).super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (this->test).super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->test).super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (__return_storage_ptr__->test).super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,_newName);
  return __return_storage_ptr__;
}

Assistant:

TestCase TestCase::withName( std::string const& _newName ) const {
        TestCase other( *this );
        other.name = _newName;
        return other;
    }